

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall
Catch::Generators::Generators<LargeNumbers>::populate
          (Generators<LargeNumbers> *this,LargeNumbers *val)

{
  IGenerator<LargeNumbers> *in_RAX;
  pointer *__ptr;
  _Head_base<0UL,_Catch::Generators::IGenerator<LargeNumbers>_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  value<LargeNumbers>((Generators *)&local_18,val);
  std::
  vector<Catch::Generators::GeneratorWrapper<LargeNumbers>,std::allocator<Catch::Generators::GeneratorWrapper<LargeNumbers>>>
  ::emplace_back<Catch::Generators::GeneratorWrapper<LargeNumbers>>
            ((vector<Catch::Generators::GeneratorWrapper<LargeNumbers>,std::allocator<Catch::Generators::GeneratorWrapper<LargeNumbers>>>
              *)&this->m_generators,(GeneratorWrapper<LargeNumbers> *)&local_18);
  if (local_18._M_head_impl != (IGenerator<LargeNumbers> *)0x0) {
    (*((local_18._M_head_impl)->super_GeneratorUntypedBase)._vptr_GeneratorUntypedBase[1])();
  }
  return;
}

Assistant:

void populate(T&& val) {
            m_generators.emplace_back(value(std::forward<T>(val)));
        }